

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O3

void __thiscall
Inter_Symbol_Generator::matrix_copy_to
          (Inter_Symbol_Generator *this,uint8_t **src,uint32_t row,uint32_t col,uint8_t **dst,
          uint32_t r_pos,uint32_t c_pos)

{
  uint32_t i;
  ulong uVar1;
  long lVar2;
  
  if (r_pos < row + r_pos) {
    uVar1 = (ulong)r_pos;
    do {
      if (c_pos < col + c_pos) {
        lVar2 = 0;
        do {
          dst[uVar1][lVar2 + (ulong)c_pos] = src[uVar1 - r_pos][lVar2];
          lVar2 = lVar2 + 1;
        } while (((ulong)c_pos - (ulong)(col + c_pos)) + lVar2 != 0);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != row + r_pos);
  }
  return;
}

Assistant:

void Inter_Symbol_Generator::matrix_copy_to(uint8_t **src, uint32_t row, uint32_t col, uint8_t **dst, uint32_t r_pos, uint32_t c_pos)
{
	uint32_t i = 0;
	uint32_t j = 0;

	for (i = r_pos; i < r_pos + row; i++)
	{
		for (j = c_pos; j < c_pos + col; j++)
		{
			dst[i][j] = src[i - r_pos][j - c_pos];
			//std::cout << i << " " << j << std::endl;
		}
	}
}